

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecProtocol.cpp
# Opt level: O1

char * HdmiCec::GetOpCodeString(OpCode opCode)

{
  if ((int)opCode < 0x32) {
    switch(opCode) {
    case OpCode_FeatureAbort:
      return "FeatureAbort";
    case OpCode_ImageViewOn:
      return "ImageViewOn";
    case OpCode_TunerStepIncrement:
      return "TunerStepIncrement";
    case OpCode_TunerStepDecrement:
      return "TunerStepDecrement";
    case OpCode_TunerDeviceStatus:
      return "TunerDeviceStatus";
    case OpCode_GiveTunerDeviceStatus:
      return "GiveTunerDeviceStatus";
    case OpCode_RecordOn:
      return "RecordOn";
    case OpCode_RecordStatus:
      return "RecordStatus";
    case OpCode_RecordOff:
      return "RecordOff";
    case OpCode_TextViewOn:
      return "TextViewOn";
    case OpCode_RecordTvScreen:
      return "RecordTvScreen";
    case OpCode_GiveDeckStatus:
      return "GiveDeckStatus";
    case OpCode_DeckStatus:
      return "DeckStatus";
    }
  }
  else {
    switch(opCode) {
    case OpCode_SetMenuLanguage:
      return "SetMenuLanguage";
    case OpCode_ClearAnalogueTimer:
      return "ClearAnalogueTimer";
    case OpCode_SetAnalogueTimer:
      return "SetAnalogueTimer";
    case OpCode_TimerStatus:
      return "TimerStatus";
    case OpCode_Standby:
      return "Standby";
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 0x65:
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x73:
    case OpCode_SystemAudioModeRequest|OpCode_ImageViewOn:
    case OpCode_SystemAudioModeRequest|OpCode_TunerStepIncrement:
    case OpCode_SystemAudioModeRequest|OpCode_TunerStepDecrement:
    case OpCode_SystemAudioModeRequest|OpCode_TunerDeviceStatus:
    case OpCode_SystemAudioModeRequest|OpCode_GiveTunerDeviceStatus:
    case OpCode_SystemAudioModeRequest|OpCode_RecordOn:
    case 0x7b:
    case OpCode_SystemAudioModeRequest|OpCode_GiveTunerDeviceStatus|OpCode_ImageViewOn:
    case 0x7f:
    case OpCode_RoutingChange|OpCode_GiveTunerDeviceStatus:
    case OpCode_ReportPowerStatus|OpCode_ImageViewOn:
    case OpCode_ReportPowerStatus|OpCode_TunerStepIncrement:
    case OpCode_ReportPowerStatus|OpCode_TunerStepDecrement:
    case OpCode_ReportPowerStatus|OpCode_GiveTunerDeviceStatus:
    case 0x9b:
    case OpCode_ReportPowerStatus|OpCode_GiveTunerDeviceStatus|OpCode_ImageViewOn:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case OpCode_ReportCurrentLatency|OpCode_ImageViewOn:
    case OpCode_ReportCurrentLatency|OpCode_TunerStepIncrement:
    case OpCode_ReportCurrentLatency|OpCode_TunerStepDecrement:
    case OpCode_ReportCurrentLatency|OpCode_TunerDeviceStatus:
    case 0xb0:
    case 0xb1:
    case 0xb2:
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xb6:
    case 0xb7:
    case 0xb8:
    case 0xb9:
    case OpCode_VendorCommandWithId|OpCode_GiveDeckStatus:
    case OpCode_VendorCommandWithId|OpCode_DeckStatus:
    case 0xbc:
    case 0xbd:
    case 0xbe:
    case 0xbf:
      break;
    case OpCode_Play:
      return "Play";
    case OpCode_DeckControl:
      return "DeckControl";
    case OpCode_TimerClearedStatus:
      return "TimerClearedStatus";
    case OpCode_UserControlPressed:
      return "UserControlPressed";
    case OpCode_UserControlReleased:
      return "UserControlReleased";
    case OpCode_GiveOsdName:
      return "GiveOsdName";
    case OpCode_SetOsdName:
      return "SetOsdName";
    case OpCode_SetOsdString:
      return "SetOsdString";
    case OpCode_SetTimerProgramTitle:
      return "SetTimerProgramTitle";
    case OpCode_SystemAudioModeRequest:
      return "SystemAudioModeRequest";
    case OpCode_GiveAudioStatus:
      return "GiveAudioStatus";
    case OpCode_SetSystemAudioMode:
      return "SetSystemAudioMode";
    case OpCode_ReportAudioStatus:
      return "ReportAudioStatus";
    case OpCode_GiveSystemAudioModeStatus:
      return "GiveSystemAudioModeStatus";
    case OpCode_SystemAudioModeStatus:
      return "SystemAudioModeStatus";
    case OpCode_RoutingChange:
      return "RoutingChange";
    case OpCode_RoutingInformation:
      return "RoutingInformation";
    case OpCode_ActiveSource:
      return "ActiveSource";
    case OpCode_GivePhysicalAddress:
      return "GivePhysicalAddress";
    case OpCode_ReportPhysicalAddress:
      return "ReportPhysicalAddress";
    case OpCode_RequestActiveSource:
      return "RequestActiveSource";
    case OpCode_SetStreamPath:
      return "SetStreamPath";
    case OpCode_DeviceVendorId:
      return "DeviceVendorId";
    case OpCode_VendorCommand:
      return "VendorCommand";
    case OpCode_VendorRemoteButtonDown:
      return "VendorRemoteButtonDown";
    case OpCode_VendorRemoteButtonUp:
      return "VendorRemoteButtonUp";
    case OpCode_GiveDeviceVendorId:
      return "GiveDeviceVendorId";
    case OpCode_MenuRequest:
      return "MenuRequest";
    case OpCode_MenuStatus:
      return "MenuStatus";
    case OpCode_GiveDevicePowerStatus:
      return "GiveDevicePowerStatus";
    case OpCode_ReportPowerStatus:
      return "ReportPowerStatus";
    case OpCode_GetMenuLanguage:
      return "GetMenuLanguage";
    case OpCode_SelectAnalogueService:
      return "SelectAnalogueService";
    case OpCode_SelectDigitalService:
      return "SelectDigitalService";
    case OpCode_SetDigitalTimer:
      return "SetDigitalTimer";
    case OpCode_ClearDigitalTimer:
      return "ClearDigitalTimer";
    case OpCode_SetAudioRate:
      return "SetAudioRate";
    case OpCode_InactiveSource:
      return "InactiveSource";
    case OpCode_CecVersion:
      return "CecVersion";
    case OpCode_GetCecVersion:
      return "GetCecVersion";
    case OpCode_VendorCommandWithId:
      return "VendorCommandWithId";
    case OpCode_ClearExternalTimer:
      return "ClearExternalTimer";
    case OpCode_SetExternalTimer:
      return "SetExternalTimer";
    case OpCode_ReportShortAudioDescriptor:
      return "ReportShortAudioDescriptor";
    case OpCode_RequestShortAudioDescriptor:
      return "RequestShortAudioDescriptor";
    case OpCode_GiveFeatures:
      return "GiveFeatures";
    case OpCode_ReportFeatures:
      return "ReportFeatures";
    case OpCode_RequestCurrentLatency:
      return "RequestCurrentLatency";
    case OpCode_ReportCurrentLatency:
      return "ReportCurrentLatency";
    case OpCode_InitiateArc:
      return "InitiateArc";
    case OpCode_ReportArcInitiated:
      return "ReportArcInitiated";
    case OpCode_ReportArcTerminated:
      return "ReportArcTerminated";
    case OpCode_RequestArcInitiation:
      return "RequestArcInitiation";
    case OpCode_RequestArcTermination:
      return "RequestArcTermination";
    case OpCode_TerminateArc:
      return "TerminateArc";
    default:
      if (opCode == OpCode_CDCMessage) {
        return "CDCMessage";
      }
      if (opCode == OpCode_Abort) {
        return "Abort";
      }
    }
  }
  return "Invalid";
}

Assistant:

const char* GetOpCodeString( OpCode opCode )
    {
        switch( opCode )
        {
        case OpCode_ActiveSource:
            return "ActiveSource";
        case OpCode_ImageViewOn:
            return "ImageViewOn";
        case OpCode_TextViewOn:
            return "TextViewOn";
        case OpCode_InactiveSource:
            return "InactiveSource";
        case OpCode_RequestActiveSource:
            return "RequestActiveSource";
        case OpCode_RoutingChange:
            return "RoutingChange";
        case OpCode_RoutingInformation:
            return "RoutingInformation";
        case OpCode_SetStreamPath:
            return "SetStreamPath";
        case OpCode_Standby:
            return "Standby";
        case OpCode_RecordOff:
            return "RecordOff";
        case OpCode_RecordOn:
            return "RecordOn";
        case OpCode_RecordStatus:
            return "RecordStatus";
        case OpCode_RecordTvScreen:
            return "RecordTvScreen";
        case OpCode_ClearAnalogueTimer:
            return "ClearAnalogueTimer";
        case OpCode_ClearDigitalTimer:
            return "ClearDigitalTimer";
        case OpCode_ClearExternalTimer:
            return "ClearExternalTimer";
        case OpCode_SetAnalogueTimer:
            return "SetAnalogueTimer";
        case OpCode_SetDigitalTimer:
            return "SetDigitalTimer";
        case OpCode_SetExternalTimer:
            return "SetExternalTimer";
        case OpCode_SetTimerProgramTitle:
            return "SetTimerProgramTitle";
        case OpCode_TimerClearedStatus:
            return "TimerClearedStatus";
        case OpCode_TimerStatus:
            return "TimerStatus";
        case OpCode_CecVersion:
            return "CecVersion";
        case OpCode_GetCecVersion:
            return "GetCecVersion";
        case OpCode_GivePhysicalAddress:
            return "GivePhysicalAddress";
        case OpCode_GetMenuLanguage:
            return "GetMenuLanguage";
        case OpCode_ReportPhysicalAddress:
            return "ReportPhysicalAddress";
        case OpCode_SetMenuLanguage:
            return "SetMenuLanguage";
        case OpCode_DeckControl:
            return "DeckControl";
        case OpCode_DeckStatus:
            return "DeckStatus";
        case OpCode_GiveDeckStatus:
            return "GiveDeckStatus";
        case OpCode_Play:
            return "Play";
        case OpCode_GiveTunerDeviceStatus:
            return "GiveTunerDeviceStatus";
        case OpCode_SelectAnalogueService:
            return "SelectAnalogueService";
        case OpCode_SelectDigitalService:
            return "SelectDigitalService";
        case OpCode_TunerDeviceStatus:
            return "TunerDeviceStatus";
        case OpCode_TunerStepDecrement:
            return "TunerStepDecrement";
        case OpCode_TunerStepIncrement:
            return "TunerStepIncrement";
        case OpCode_DeviceVendorId:
            return "DeviceVendorId";
        case OpCode_GiveDeviceVendorId:
            return "GiveDeviceVendorId";
        case OpCode_VendorCommand:
            return "VendorCommand";
        case OpCode_VendorCommandWithId:
            return "VendorCommandWithId";
        case OpCode_VendorRemoteButtonDown:
            return "VendorRemoteButtonDown";
        case OpCode_VendorRemoteButtonUp:
            return "VendorRemoteButtonUp";
        case OpCode_SetOsdString:
            return "SetOsdString";
        case OpCode_GiveOsdName:
            return "GiveOsdName";
        case OpCode_SetOsdName:
            return "SetOsdName";
        case OpCode_MenuRequest:
            return "MenuRequest";
        case OpCode_MenuStatus:
            return "MenuStatus";
        case OpCode_UserControlPressed:
            return "UserControlPressed";
        case OpCode_UserControlReleased:
            return "UserControlReleased";
        case OpCode_GiveDevicePowerStatus:
            return "GiveDevicePowerStatus";
        case OpCode_ReportPowerStatus:
            return "ReportPowerStatus";
        case OpCode_FeatureAbort:
            return "FeatureAbort";
        case OpCode_Abort:
            return "Abort";
        case OpCode_GiveAudioStatus:
            return "GiveAudioStatus";
        case OpCode_GiveSystemAudioModeStatus:
            return "GiveSystemAudioModeStatus";
        case OpCode_ReportAudioStatus:
            return "ReportAudioStatus";
        case OpCode_SetSystemAudioMode:
            return "SetSystemAudioMode";
        case OpCode_SystemAudioModeRequest:
            return "SystemAudioModeRequest";
        case OpCode_SystemAudioModeStatus:
            return "SystemAudioModeStatus";
        case OpCode_SetAudioRate:
            return "SetAudioRate";
        case OpCode_ReportShortAudioDescriptor:
            return "ReportShortAudioDescriptor";
        case OpCode_RequestShortAudioDescriptor:
            return "RequestShortAudioDescriptor";
        case OpCode_GiveFeatures:
            return "GiveFeatures";
        case OpCode_ReportFeatures:
            return "ReportFeatures";
        case OpCode_RequestCurrentLatency:
            return "RequestCurrentLatency";
        case OpCode_ReportCurrentLatency:
            return "ReportCurrentLatency";
        case OpCode_InitiateArc:
            return "InitiateArc";
        case OpCode_ReportArcInitiated:
            return "ReportArcInitiated";
        case OpCode_ReportArcTerminated:
            return "ReportArcTerminated";
        case OpCode_RequestArcInitiation:
            return "RequestArcInitiation";
        case OpCode_RequestArcTermination:
            return "RequestArcTermination";
        case OpCode_TerminateArc:
            return "TerminateArc";
        case OpCode_CDCMessage:
            return "CDCMessage";
        default:
            break;
        }
        return "Invalid";
    }